

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O0

void __thiscall
QGraphicsItem::setCacheMode(QGraphicsItem *this,CacheMode mode,QSize *logicalCacheSize)

{
  bool bVar1;
  uint uVar2;
  QGraphicsItemPrivate *pQVar3;
  QGraphicsItemCache *this_00;
  QGraphicsItem *in_RDX;
  uint in_ESI;
  QGraphicsItemPrivate *in_RDI;
  long in_FS_OFFSET;
  QGraphicsItemCache *cache;
  bool noVisualChange;
  CacheMode lastMode;
  undefined6 in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffff9e;
  undefined1 uVar4;
  undefined4 in_stack_ffffffffffffffb8;
  uint uVar5;
  QGraphicsItemPrivate *this_01;
  QRectF local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = in_RDI;
  pQVar3 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
           operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                       *)&in_RDI->extras);
  uVar2 = (uint)(*(ulong *)&pQVar3->field_0x160 >> 0x15) & 3;
  pQVar3 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
           operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                       *)&in_RDI->extras);
  *(ulong *)&pQVar3->field_0x160 =
       *(ulong *)&pQVar3->field_0x160 & 0xffffffffff9fffff | ((ulong)in_ESI & 3) << 0x15;
  if ((((in_ESI != 0) || (uVar4 = true, uVar2 != 0)) &&
      ((in_ESI != 0 || (uVar4 = true, uVar2 != 2)))) &&
     ((in_ESI != 2 || (uVar4 = true, uVar2 != 0)))) {
    in_stack_ffffffffffffff9e = in_ESI == 2 && uVar2 == 2;
    uVar4 = in_stack_ffffffffffffff9e;
  }
  uVar5 = CONCAT13(uVar4,(int3)in_stack_ffffffffffffffb8);
  if (in_ESI == 0) {
    QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::operator->
              ((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_> *
               )&in_RDI->extras);
    QGraphicsItemPrivate::removeExtraItemCache((QGraphicsItemPrivate *)CONCAT44(uVar2,uVar5));
  }
  else {
    QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::operator->
              ((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_> *
               )&in_RDI->extras);
    this_00 = QGraphicsItemPrivate::extraItemCache(this_01);
    QGraphicsItemCache::purge(this_00);
    if (in_ESI == 1) {
      if ((uVar2 == 1) &&
         (bVar1 = ::operator==((QSize *)in_RDI,
                               (QSize *)CONCAT17(uVar4,CONCAT16(in_stack_ffffffffffffff9e,
                                                                in_stack_ffffffffffffff98))), bVar1)
         ) {
        uVar5 = CONCAT13(1,(int3)uVar5);
      }
      this_00->fixedSize = (QSize)in_RDX->_vptr_QGraphicsItem;
    }
  }
  if ((uVar5 & 0x1000000) == 0) {
    QRectF::QRectF(&local_28);
    update(in_RDX,(QRectF *)CONCAT44(uVar2,uVar5));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsItem::setCacheMode(CacheMode mode, const QSize &logicalCacheSize)
{
    CacheMode lastMode = CacheMode(d_ptr->cacheMode);
    d_ptr->cacheMode = mode;
    bool noVisualChange = (mode == NoCache && lastMode == NoCache)
                          || (mode == NoCache && lastMode == DeviceCoordinateCache)
                          || (mode == DeviceCoordinateCache && lastMode == NoCache)
                          || (mode == DeviceCoordinateCache && lastMode == DeviceCoordinateCache);
    if (mode == NoCache) {
        d_ptr->removeExtraItemCache();
    } else {
        QGraphicsItemCache *cache = d_ptr->extraItemCache();

        // Reset old cache
        cache->purge();

        if (mode == ItemCoordinateCache) {
            if (lastMode == mode && cache->fixedSize == logicalCacheSize)
                noVisualChange = true;
            cache->fixedSize = logicalCacheSize;
        }
    }
    if (!noVisualChange)
        update();
}